

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::EnumDescriptorTest_ValueType_Test::TestBody
          (EnumDescriptorTest_ValueType_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_c0;
  Message local_b8;
  EnumDescriptor *local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_3;
  Message local_90;
  EnumDescriptor *local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_2;
  Message local_68;
  EnumDescriptor *local_60;
  undefined1 local_58 [8];
  AssertionResult gtest_ar_1;
  Message local_40 [3];
  EnumDescriptor *local_28;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  EnumDescriptorTest_ValueType_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_28 = EnumValueDescriptor::type((this->super_EnumDescriptorTest).foo_);
  testing::internal::EqHelper::
  Compare<const_google::protobuf::EnumDescriptor_*,_const_google::protobuf::EnumDescriptor_*,_nullptr>
            ((EqHelper *)local_20,"enum_","foo_->type()",&(this->super_EnumDescriptorTest).enum_,
             &local_28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x718,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_60 = EnumValueDescriptor::type((this->super_EnumDescriptorTest).bar_);
  testing::internal::EqHelper::
  Compare<const_google::protobuf::EnumDescriptor_*,_const_google::protobuf::EnumDescriptor_*,_nullptr>
            ((EqHelper *)local_58,"enum_","bar_->type()",&(this->super_EnumDescriptorTest).enum_,
             &local_60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x719,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  local_88 = EnumValueDescriptor::type((this->super_EnumDescriptorTest).foo2_);
  testing::internal::EqHelper::
  Compare<const_google::protobuf::EnumDescriptor_*,_const_google::protobuf::EnumDescriptor_*,_nullptr>
            ((EqHelper *)local_80,"enum2_","foo2_->type()",&(this->super_EnumDescriptorTest).enum2_,
             &local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x71a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_b0 = EnumValueDescriptor::type((this->super_EnumDescriptorTest).baz2_);
  testing::internal::EqHelper::
  Compare<const_google::protobuf::EnumDescriptor_*,_const_google::protobuf::EnumDescriptor_*,_nullptr>
            ((EqHelper *)local_a8,"enum2_","baz2_->type()",&(this->super_EnumDescriptorTest).enum2_,
             &local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x71b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  return;
}

Assistant:

TEST_F(EnumDescriptorTest, ValueType) {
  EXPECT_EQ(enum_, foo_->type());
  EXPECT_EQ(enum_, bar_->type());
  EXPECT_EQ(enum2_, foo2_->type());
  EXPECT_EQ(enum2_, baz2_->type());
}